

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O1

void Saig_ManBlockPo(Aig_Man_t *pAig,int nCycles)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p0;
  Aig_Obj_t *pFaninNew;
  int iVar2;
  long lVar3;
  
  if (nCycles < 1) {
    __assert_fail("nCycles > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDual.c"
                  ,0xd5,"void Saig_ManBlockPo(Aig_Man_t *, int)");
  }
  p0 = pAig->pConst1;
  pAVar1 = p0;
  iVar2 = nCycles;
  do {
    Aig_ObjCreateCo(pAig,pAVar1);
    pAVar1 = Aig_ObjCreateCi(pAig);
    p0 = Aig_And(pAig,p0,pAVar1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (0 < pAig->nTruePos) {
    lVar3 = 0;
    do {
      if (pAig->vCos->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar1 = (Aig_Obj_t *)pAig->vCos->pArray[lVar3];
      pFaninNew = Aig_And(pAig,pAVar1->pFanin0,p0);
      Aig_ObjPatchFanin0(pAig,pAVar1,pFaninNew);
      lVar3 = lVar3 + 1;
    } while (lVar3 < pAig->nTruePos);
  }
  Aig_ManSetRegNum(pAig,nCycles + pAig->nRegs);
  Aig_ManCleanup(pAig);
  return;
}

Assistant:

void Saig_ManBlockPo( Aig_Man_t * pAig, int nCycles )
{
    Aig_Obj_t * pObj, * pCond, * pPrev, * pTemp;
    int i;
    assert( nCycles > 0 );
    // add N flops (assuming 1-hot encoding of cycles)
    pPrev = Aig_ManConst1(pAig);
    pCond = Aig_ManConst1(pAig);
    for ( i = 0; i < nCycles; i++ )
    {
        Aig_ObjCreateCo( pAig, pPrev );
        pPrev = Aig_ObjCreateCi( pAig );
        pCond = Aig_And( pAig, pCond, pPrev );
    }
    // update the POs
    Saig_ManForEachPo( pAig, pObj, i )
    {
        pTemp = Aig_And( pAig, Aig_ObjChild0(pObj), pCond );
        Aig_ObjPatchFanin0( pAig, pObj, pTemp );
    }
    // set the flops
    Aig_ManSetRegNum( pAig, Aig_ManRegNum(pAig) + nCycles );
    Aig_ManCleanup( pAig );
}